

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O1

REF_STATUS
ref_collapse_edge_cad_constrained(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  int iVar1;
  REF_CELL ref_cell;
  REF_GEOM ref_geom;
  REF_ADJ_ITEM pRVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  REF_INT cell;
  ulong uVar6;
  REF_BOOL edge2;
  REF_BOOL edge1;
  REF_BOOL edge0;
  REF_INT nodes [27];
  int local_bc;
  int local_b8;
  int local_b4;
  REF_BOOL *local_b0;
  REF_INT local_a8 [30];
  
  ref_cell = ref_grid->cell[3];
  ref_geom = ref_grid->geom;
  *allowed = 1;
  uVar6 = 0xffffffff;
  if (-1 < node1) {
    uVar6 = 0xffffffff;
    if (node1 < ref_cell->ref_adj->nnode) {
      uVar6 = (ulong)(uint)ref_cell->ref_adj->first[(uint)node1];
    }
  }
  if ((int)uVar6 != -1) {
    cell = ref_cell->ref_adj->item[(int)uVar6].ref;
    local_b0 = allowed;
    do {
      uVar4 = ref_cell_nodes(ref_cell,cell,local_a8);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0x300,"ref_collapse_edge_cad_constrained",(ulong)uVar4,"nodes");
        return uVar4;
      }
      if ((long)ref_cell->node_per < 1) {
LAB_00168306:
        if (0 < ref_cell->node_per) {
          lVar5 = 0;
          do {
            if (local_a8[lVar5] == node1) {
              local_a8[lVar5] = node0;
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 < ref_cell->node_per);
        }
        uVar4 = ref_geom_is_a(ref_geom,local_a8[0],1,&local_b4);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                 ,0x309,"ref_collapse_edge_cad_constrained",(ulong)uVar4,"e0");
          return uVar4;
        }
        uVar4 = ref_geom_is_a(ref_geom,local_a8[1],1,&local_b8);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                 ,0x30a,"ref_collapse_edge_cad_constrained",(ulong)uVar4,"e1");
          return uVar4;
        }
        uVar4 = ref_geom_is_a(ref_geom,local_a8[2],1,&local_bc);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                 ,0x30b,"ref_collapse_edge_cad_constrained",(ulong)uVar4,"e2");
          return uVar4;
        }
        if (((local_b4 != 0) && (local_b8 != 0)) && (local_bc != 0)) {
          *local_b0 = 0;
          return 0;
        }
      }
      else {
        lVar5 = 0;
        bVar3 = false;
        do {
          if (local_a8[lVar5] == node0) {
            bVar3 = true;
          }
          lVar5 = lVar5 + 1;
        } while (ref_cell->node_per != lVar5);
        if (!bVar3) goto LAB_00168306;
      }
      pRVar2 = ref_cell->ref_adj->item;
      iVar1 = pRVar2[(int)uVar6].next;
      uVar6 = (ulong)iVar1;
      if (uVar6 == 0xffffffffffffffff) {
        cell = -1;
      }
      else {
        cell = pRVar2[uVar6].ref;
      }
    } while (iVar1 != -1);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge_cad_constrained(REF_GRID ref_grid,
                                                     REF_INT node0,
                                                     REF_INT node1,
                                                     REF_BOOL *allowed) {
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT item, cell, node, nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL will_be_collapsed;
  REF_BOOL edge0, edge1, edge2;

  *allowed = REF_TRUE;

  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

    will_be_collapsed = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) will_be_collapsed = REF_TRUE;
    if (will_be_collapsed) continue;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = node0;
    RSS(ref_geom_is_a(ref_geom, nodes[0], REF_GEOM_EDGE, &edge0), "e0");
    RSS(ref_geom_is_a(ref_geom, nodes[1], REF_GEOM_EDGE, &edge1), "e1");
    RSS(ref_geom_is_a(ref_geom, nodes[2], REF_GEOM_EDGE, &edge2), "e2");
    if (edge0 && edge1 && edge2) {
      *allowed = REF_FALSE;
      break;
    }
  }

  return REF_SUCCESS;
}